

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket_adt.c
# Opt level: O0

msocket_adt_error_t msocket_bytearray_reserve(msocket_bytearray_t *self,uint32_t u32NewLen)

{
  msocket_adt_error_t errorCode;
  uint32_t u32NewLen_local;
  msocket_bytearray_t *self_local;
  
  if (self == (msocket_bytearray_t *)0x0) {
    self_local._7_1_ = '\x01';
  }
  else if ((u32NewLen <= self->u32AllocLen) ||
          (self_local._7_1_ = msocket_bytearray_grow(self,u32NewLen), self_local._7_1_ == '\0')) {
    self_local._7_1_ = '\0';
  }
  return self_local._7_1_;
}

Assistant:

msocket_adt_error_t msocket_bytearray_reserve(msocket_bytearray_t *self, uint32_t u32NewLen){
   if(self){
      if(u32NewLen > self->u32AllocLen){
         msocket_adt_error_t errorCode = msocket_bytearray_grow(self,u32NewLen);
         if(errorCode != ADT_NO_ERROR){
            return errorCode;
         }
      }
      return ADT_NO_ERROR;
   }
   return ADT_INVALID_ARGUMENT_ERROR;
}